

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-c.cpp
# Opt level: O2

duckdb_blob duckdb_value_blob(duckdb_result *result,idx_t col,idx_t row)

{
  void *__src;
  size_t __size;
  bool bVar1;
  void *pvVar2;
  duckdb_blob dVar3;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    if (result->deprecated_columns[col].deprecated_type == DUCKDB_TYPE_BLOB) {
      pvVar2 = result->deprecated_columns[col].deprecated_data;
      __src = *(void **)((long)pvVar2 + row * 0x10);
      __size = *(size_t *)((long)pvVar2 + row * 0x10 + 8);
      pvVar2 = malloc(__size);
      dVar3.size = __size;
      dVar3.data = pvVar2;
      switchD_00916250::default(pvVar2,__src,__size);
      return dVar3;
    }
  }
  dVar3 = duckdb::FetchDefaultValue::Operation<duckdb_blob>();
  return dVar3;
}

Assistant:

duckdb_blob duckdb_value_blob(duckdb_result *result, idx_t col, idx_t row) {
	if (CanFetchValue(result, col, row) && result->deprecated_columns[col].deprecated_type == DUCKDB_TYPE_BLOB) {
		auto internal_result = UnsafeFetch<duckdb_blob>(result, col, row);

		duckdb_blob result_blob;
		result_blob.data = malloc(internal_result.size);
		result_blob.size = internal_result.size;
		memcpy(result_blob.data, internal_result.data, internal_result.size);
		return result_blob;
	}
	return FetchDefaultValue::Operation<duckdb_blob>();
}